

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_wiener_convolve_avx2.c
# Opt level: O0

void av1_highbd_wiener_convolve_add_src_avx2
               (uint8_t *src8,ptrdiff_t src_stride,uint8_t *dst8,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params,int bd)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  byte bVar10;
  __m256i v;
  __m256i v_00;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  ushort uVar55;
  ushort uVar56;
  uint uVar57;
  __m256i *palVar58;
  byte bVar59;
  long lVar60;
  ulong uVar61;
  longlong lVar62;
  long in_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  char cVar63;
  long in_RSI;
  void *pvVar64;
  long in_RDI;
  __m256i *in_R8;
  ulong uVar65;
  undefined8 uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  void *a;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined1 auVar76 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar77 [32];
  __m128i alVar95;
  __m128i lo;
  __m128i lo_00;
  __m128i lo_01;
  __m128i lo_02;
  __m128i lo_03;
  __m128i lo_04;
  __m128i lo_05;
  __m128i hi;
  __m128i hi_00;
  __m128i hi_01;
  __m128i hi_02;
  __m128i hi_03;
  __m128i hi_04;
  __m128i hi_05;
  __m128i hi_06;
  __m256i *in_stack_00000008;
  undefined4 in_stack_0000002c;
  __m256i res_16bit;
  __m256i res_hi_round;
  __m256i res_lo_round;
  __m256i res_hi;
  __m256i res_lo;
  __m256i res_odd_1;
  __m256i res_7_1;
  __m256i res_5_1;
  __m256i res_3_1;
  __m256i res_1_1;
  __m256i src_7_1;
  __m256i src_5_1;
  __m256i src_3_1;
  __m256i src_1_1;
  __m256i res_even_1;
  __m256i res_6_1;
  __m256i res_4_1;
  __m256i res_2_1;
  __m256i res_0_1;
  __m256i src_6_1;
  __m256i src_4_1;
  __m256i src_2_1;
  __m256i src_0_1;
  __m256i data_7;
  __m256i data_6;
  __m256i data_5;
  __m256i data_4;
  __m256i data_3;
  __m256i data_2;
  __m256i data_1;
  __m256i data_0;
  uint16_t *temp_ij;
  int j_1;
  int i_1;
  __m256i round_const_1;
  __m256i coeffs_67_1;
  __m256i coeffs_45_1;
  __m256i coeffs_23_1;
  __m256i coeffs_01_1;
  __m128i coeffs_67_128_1;
  __m128i coeffs_45_128_1;
  __m128i coeffs_23_128_1;
  __m128i coeffs_01_128_1;
  __m128i coeffs_4567_1;
  __m128i coeffs_0123_1;
  __m128i coeffs_y;
  __m256i clamp_high;
  __m256i res_clamped;
  __m256i res;
  __m256i res_odd;
  __m256i res_odd_sum;
  __m256i res_even;
  __m256i res_even_sum;
  __m256i res_7;
  __m256i res_6;
  __m256i res_5;
  __m256i res_4;
  __m256i res_3;
  __m256i res_2;
  __m256i res_1;
  __m256i res_0;
  __m256i src_7;
  __m256i src_6;
  __m256i src_5;
  __m256i src_4;
  __m256i src_3;
  __m256i src_2;
  __m256i src_1;
  __m256i src_0;
  uint16_t *src_ij;
  int j;
  int i;
  __m256i round_const;
  __m256i coeffs_67;
  __m256i coeffs_45;
  __m256i coeffs_23;
  __m256i coeffs_01;
  __m128i coeffs_67_128;
  __m128i coeffs_45_128;
  __m128i coeffs_23_128;
  __m128i coeffs_01_128;
  __m128i coeffs_4567;
  __m128i coeffs_0123;
  __m128i coeffs_x;
  __m256i clamp_high_ep;
  __m256i clamp_low;
  __m128i offset;
  __m256i zero_256;
  __m128i zero_128;
  uint16_t *src_ptr;
  int center_tap;
  int intermediate_height;
  uint16_t temp [17280];
  uint16_t *dst;
  uint16_t *src;
  unkbyte10 in_stack_ffffffffffff5e40;
  undefined2 in_stack_ffffffffffff5e4a;
  undefined4 in_stack_ffffffffffff5e4c;
  int iVar96;
  undefined4 in_stack_ffffffffffff5e50;
  undefined2 in_stack_ffffffffffff5e54;
  void *local_a1a0;
  undefined8 uStack_a198;
  undefined8 uStack_a188;
  undefined8 local_a180;
  undefined8 uStack_a178;
  undefined8 uStack_a170;
  undefined8 uStack_a168;
  undefined8 local_a160;
  undefined8 uStack_a158;
  undefined8 uStack_a150;
  undefined8 uStack_a148;
  undefined8 local_a140;
  undefined8 uStack_a138;
  undefined8 uStack_a130;
  undefined8 uStack_a128;
  undefined8 local_a120;
  undefined8 uStack_a118;
  undefined8 uStack_a110;
  undefined8 uStack_a108;
  undefined8 local_a100;
  undefined8 uStack_a0f8;
  undefined8 uStack_a0f0;
  undefined8 uStack_a0e8;
  undefined8 local_a0e0;
  undefined8 uStack_a0d8;
  undefined8 uStack_a0d0;
  undefined8 uStack_a0c8;
  undefined8 local_a0c0;
  undefined8 uStack_a0b8;
  undefined8 uStack_a0b0;
  undefined8 uStack_a0a8;
  undefined8 local_a0a0;
  undefined8 uStack_a098;
  undefined8 uStack_a090;
  undefined8 uStack_a088;
  undefined8 local_a080;
  undefined8 uStack_a078;
  undefined8 uStack_a070;
  undefined8 uStack_a068;
  undefined8 local_a060;
  undefined8 uStack_a058;
  undefined8 uStack_a050;
  undefined8 uStack_a048;
  undefined8 local_a040;
  undefined8 uStack_a038;
  undefined8 uStack_a030;
  undefined8 uStack_a028;
  undefined8 local_a020;
  undefined8 uStack_a018;
  undefined8 uStack_a010;
  undefined8 uStack_a008;
  undefined8 local_a000;
  undefined8 uStack_9ff8;
  undefined8 uStack_9ff0;
  undefined8 uStack_9fe8;
  undefined8 local_9fe0;
  undefined8 uStack_9fd8;
  undefined8 uStack_9fd0;
  undefined8 uStack_9fc8;
  undefined8 local_9fc0;
  undefined8 uStack_9fb8;
  undefined8 uStack_9fb0;
  undefined8 uStack_9fa8;
  undefined8 local_9fa0;
  undefined8 uStack_9f98;
  undefined8 uStack_9f90;
  undefined8 uStack_9f88;
  undefined8 local_9f80;
  undefined8 uStack_9f78;
  undefined8 uStack_9f70;
  undefined8 uStack_9f68;
  undefined8 local_9f60;
  undefined8 uStack_9f58;
  undefined8 uStack_9f50;
  undefined8 uStack_9f48;
  undefined8 local_9f40;
  undefined8 uStack_9f38;
  undefined8 uStack_9f30;
  undefined8 uStack_9f28;
  undefined8 local_9f20;
  undefined8 uStack_9f18;
  undefined8 uStack_9f10;
  undefined8 uStack_9f08;
  undefined8 local_9f00;
  undefined8 uStack_9ef8;
  undefined8 uStack_9ef0;
  undefined8 uStack_9ee8;
  undefined8 local_9ee0;
  undefined8 uStack_9ed8;
  undefined8 uStack_9ed0;
  undefined8 uStack_9ec8;
  undefined8 local_9ec0;
  undefined8 uStack_9eb8;
  undefined8 uStack_9eb0;
  undefined8 uStack_9ea8;
  int local_9d88;
  int local_9d84;
  undefined8 local_9cd0;
  undefined8 uStack_9cc8;
  undefined8 local_9cc0;
  undefined8 uStack_9cb8;
  undefined8 local_9cb0;
  undefined8 uStack_9ca8;
  undefined8 local_9ca0;
  undefined8 uStack_9c98;
  undefined8 local_9c90;
  undefined8 uStack_9c88;
  undefined8 local_9c80;
  undefined8 uStack_9c78;
  undefined8 local_9c70;
  undefined8 uStack_9c68;
  undefined8 local_9c40;
  undefined8 uStack_9c38;
  undefined8 uStack_9c30;
  undefined8 uStack_9c28;
  undefined8 local_9c20;
  undefined8 uStack_9c18;
  undefined8 uStack_9c10;
  undefined8 uStack_9c08;
  undefined8 local_9c00;
  undefined8 uStack_9bf8;
  undefined8 uStack_9bf0;
  undefined8 uStack_9be8;
  undefined8 local_9be0;
  undefined8 uStack_9bd8;
  undefined8 uStack_9bd0;
  undefined8 uStack_9bc8;
  undefined8 local_9bc0;
  undefined8 uStack_9bb8;
  undefined8 uStack_9bb0;
  undefined8 uStack_9ba8;
  undefined8 local_9ba0;
  undefined8 uStack_9b98;
  undefined8 uStack_9b90;
  undefined8 uStack_9b88;
  undefined8 local_9b80;
  undefined8 uStack_9b78;
  undefined8 uStack_9b70;
  undefined8 uStack_9b68;
  undefined8 local_9b60;
  undefined8 uStack_9b58;
  undefined8 uStack_9b50;
  undefined8 uStack_9b48;
  undefined8 local_9b40;
  undefined8 uStack_9b38;
  undefined8 uStack_9b30;
  undefined8 uStack_9b28;
  undefined8 local_9b20;
  undefined8 uStack_9b18;
  undefined8 uStack_9b10;
  undefined8 uStack_9b08;
  undefined8 local_9b00;
  undefined8 uStack_9af8;
  undefined8 uStack_9af0;
  undefined8 uStack_9ae8;
  undefined8 local_9ae0;
  undefined8 uStack_9ad8;
  undefined8 uStack_9ad0;
  undefined8 uStack_9ac8;
  undefined8 local_9ac0;
  undefined8 uStack_9ab8;
  undefined8 uStack_9ab0;
  undefined8 uStack_9aa8;
  undefined8 local_9aa0;
  undefined8 uStack_9a98;
  undefined8 uStack_9a90;
  undefined8 uStack_9a88;
  int local_9968;
  int local_9964;
  undefined8 local_98b0;
  undefined8 uStack_98a8;
  undefined8 local_98a0;
  undefined8 uStack_9898;
  undefined8 local_9890;
  undefined8 uStack_9888;
  undefined8 local_9880;
  undefined8 uStack_9878;
  undefined8 local_9870;
  undefined8 uStack_9868;
  undefined8 local_9860;
  undefined8 uStack_9858;
  undefined8 local_9850;
  undefined8 uStack_9848;
  undefined8 local_97f0;
  undefined8 uStack_97e8;
  longlong local_97a0 [32];
  longlong alStack_96a0 [32];
  longlong alStack_95a0 [32];
  longlong alStack_94a0 [32];
  longlong alStack_93a0 [32];
  longlong alStack_92a0 [32];
  longlong alStack_91a0 [32];
  longlong alStack_90a0 [4098];
  long local_1090;
  long local_1088;
  long local_1060;
  undefined8 local_1050;
  undefined8 uStack_1048;
  undefined1 local_1040 [32];
  ushort local_1014;
  ushort local_1012;
  undefined8 local_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 local_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 local_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 local_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 local_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 local_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 local_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 local_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 local_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 local_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 local_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  uint local_e48;
  uint local_e44;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined1 local_c20 [16];
  undefined1 auStack_c10 [16];
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [16];
  undefined1 auStack_bd0 [16];
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined1 local_ba0 [16];
  undefined1 auStack_b90 [16];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [16];
  undefined1 auStack_b50 [16];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined1 local_ae0 [16];
  undefined1 auStack_ad0 [16];
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [16];
  undefined1 auStack_a90 [16];
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined1 local_a60 [16];
  undefined1 auStack_a50 [16];
  undefined1 local_a40 [16];
  undefined1 auStack_a30 [16];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [16];
  undefined1 auStack_9f0 [16];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  uint local_624;
  undefined1 local_620 [32];
  uint local_5e4;
  undefined1 local_5e0 [32];
  uint local_5a4;
  undefined1 local_5a0 [32];
  uint local_564;
  undefined1 local_560 [32];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined8 local_440;
  ulong uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  ulong uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [16];
  undefined1 auStack_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 auStack_390 [16];
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  undefined1 local_340 [16];
  undefined1 auStack_330 [16];
  undefined1 local_320 [16];
  undefined1 auStack_310 [16];
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 auStack_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 auStack_290 [16];
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  ushort local_120;
  ushort local_11e;
  ushort local_11c;
  ushort local_11a;
  ushort local_118;
  ushort local_116;
  ushort local_114;
  ushort local_112;
  ushort local_110;
  ushort local_10e;
  ushort local_10c;
  ushort local_10a;
  ushort local_108;
  ushort local_106;
  ushort local_104;
  ushort local_102;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  ushort local_e0;
  ushort local_de;
  ushort local_dc;
  ushort local_da;
  ushort local_d8;
  ushort local_d6;
  ushort local_d4;
  ushort local_d2;
  ushort local_d0;
  ushort local_ce;
  ushort local_cc;
  ushort local_ca;
  ushort local_c8;
  ushort local_c6;
  ushort local_c4;
  ushort local_c2;
  undefined1 local_c0 [32];
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined1 local_80 [32];
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  longlong extraout_RDX;
  longlong extraout_RDX_02;
  
  local_1088 = in_RDI * 2;
  local_1090 = in_RDX * 2;
  lVar60 = in_RSI * -6;
  lVar1 = local_1088 + -6;
  local_1050 = 0;
  uStack_1048 = 0;
  local_1040._8_8_ = SUB328(ZEXT832(0),4);
  uVar50 = local_1040._8_8_;
  auVar75 = vpinsrw_avx(ZEXT816(0),0x80,3);
  bVar10 = (byte)conv_params;
  bVar59 = (bVar10 - (char)*(undefined4 *)CONCAT44(in_stack_0000002c,h)) + 8;
  uVar61 = (ulong)CONCAT31((int3)((uint)*(undefined4 *)CONCAT44(in_stack_0000002c,h) >> 8),bVar59);
  uVar55 = (short)(1 << (bVar59 & 0x1f)) - 1;
  auVar68 = vpinsrw_avx(ZEXT216(uVar55),(uint)uVar55,1);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar55,2);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar55,3);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar55,4);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar55,5);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar55,6);
  auVar2 = vpinsrw_avx(auVar68,(uint)uVar55,7);
  auVar68 = vpinsrw_avx(ZEXT216(uVar55),(uint)uVar55,1);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar55,2);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar55,3);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar55,4);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar55,5);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar55,6);
  auStack_130 = vpinsrw_avx(auVar68,(uint)uVar55,7);
  local_140._0_8_ = auVar2._0_8_;
  uVar51 = local_140._0_8_;
  local_140._8_8_ = auVar2._8_8_;
  uVar52 = local_140._8_8_;
  uVar53 = auStack_130._0_8_;
  uVar54 = auStack_130._8_8_;
  palVar58 = in_R8;
  uVar66 = local_140._0_8_;
  uVar78 = local_140._8_8_;
  local_1060 = in_RSI;
  local_1040 = ZEXT832(0) << 0x20;
  local_1012 = uVar55;
  local_140 = auVar2;
  local_120 = uVar55;
  local_11e = uVar55;
  local_11c = uVar55;
  local_11a = uVar55;
  local_118 = uVar55;
  local_116 = uVar55;
  local_114 = uVar55;
  local_112 = uVar55;
  local_110 = uVar55;
  local_10e = uVar55;
  local_10c = uVar55;
  local_10a = uVar55;
  local_108 = uVar55;
  local_106 = uVar55;
  local_104 = uVar55;
  local_102 = uVar55;
  alVar95 = xx_loadu_128(in_R8);
  hi[1] = alVar95[1];
  local_97f0 = auVar75._0_8_;
  uStack_97e8 = auVar75._8_8_;
  local_ff0 = local_97f0;
  uStack_fe8 = uStack_97e8;
  auVar68._8_8_ = uVar78;
  auVar68._0_8_ = uVar66;
  auVar68 = vpaddw_avx(auVar68,auVar75);
  local_9850 = auVar68._0_8_;
  uStack_9848 = auVar68._8_8_;
  local_fa0 = local_9850;
  uStack_f98 = uStack_9848;
  local_fb0 = local_9850;
  uStack_fa8 = uStack_9848;
  auVar67 = vpunpckldq_avx(auVar68,auVar68);
  local_f60 = local_9850;
  uStack_f58 = uStack_9848;
  local_f70 = local_9850;
  uStack_f68 = uStack_9848;
  auVar68 = vpunpckhdq_avx(auVar68,auVar68);
  local_9860 = auVar67._0_8_;
  uStack_9858 = auVar67._8_8_;
  local_ee0 = local_9860;
  uStack_ed8 = uStack_9858;
  local_ef0 = local_9860;
  uStack_ee8 = uStack_9858;
  auVar83 = vpunpcklqdq_avx(auVar67,auVar67);
  local_e60 = local_9860;
  uStack_e58 = uStack_9858;
  local_e70 = local_9860;
  uStack_e68 = uStack_9858;
  auVar67 = vpunpckhqdq_avx(auVar67,auVar67);
  local_9870 = auVar68._0_8_;
  uStack_9868 = auVar68._8_8_;
  local_f00 = local_9870;
  uStack_ef8 = uStack_9868;
  local_f10 = local_9870;
  uStack_f08 = uStack_9868;
  auVar84 = vpunpcklqdq_avx(auVar68,auVar68);
  local_e80 = local_9870;
  uStack_e78 = uStack_9868;
  local_e90 = local_9870;
  uStack_e88 = uStack_9868;
  auVar68 = vpunpckhqdq_avx(auVar68,auVar68);
  local_9880 = auVar83._0_8_;
  uStack_9878 = auVar83._8_8_;
  uVar79 = 0;
  uVar91 = 0;
  alVar95[1] = (longlong)palVar58;
  alVar95[0] = uVar61;
  hi[0] = in_RSI;
  local_fe0 = uVar66;
  uStack_fd8 = uVar78;
  yy_set_m128i(in_R8,hi,alVar95);
  local_9890 = auVar67._0_8_;
  uStack_9888 = auVar67._8_8_;
  uVar80 = 0;
  uVar92 = 0;
  lo[1] = (longlong)palVar58;
  lo[0] = uVar61;
  hi_00[1] = extraout_RDX;
  hi_00[0] = in_RSI;
  yy_set_m128i(in_R8,hi_00,lo);
  local_98a0 = auVar84._0_8_;
  uStack_9898 = auVar84._8_8_;
  uVar81 = 0;
  uVar93 = 0;
  lo_00[1] = (longlong)palVar58;
  lo_00[0] = uVar61;
  hi_01[1] = extraout_RDX_00;
  hi_01[0] = in_RSI;
  yy_set_m128i(in_R8,hi_01,lo_00);
  local_98b0 = auVar68._0_8_;
  uStack_98a8 = auVar68._8_8_;
  uVar82 = 0;
  uVar94 = 0;
  lo_01[1] = (longlong)palVar58;
  lo_01[0] = uVar61;
  hi_02[1] = extraout_RDX_01;
  hi_02[0] = in_RSI;
  yy_set_m128i(in_R8,hi_02,lo_01);
  local_e44 = (1 << (*(char *)CONCAT44(in_stack_0000002c,h) - 1U & 0x1f)) +
              (1 << (bVar10 + 6 & 0x1f));
  uVar61 = (ulong)local_e44;
  uVar65 = (ulong)local_e44;
  pvVar64 = (void *)(ulong)local_e44;
  auVar68 = vpinsrd_avx(ZEXT416(local_e44),local_e44,1);
  auVar68 = vpinsrd_avx(auVar68,local_e44,2);
  auVar68 = vpinsrd_avx(auVar68,local_e44,3);
  auVar67 = vpinsrd_avx(ZEXT416(local_e44),local_e44,1);
  auVar67 = vpinsrd_avx(auVar67,local_e44,2);
  auVar67 = vpinsrd_avx(auVar67,local_e44,3);
  auVar76._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar67;
  auVar76._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68;
  local_c0._16_8_ = auVar76._16_8_;
  uVar66 = local_c0._16_8_;
  local_c0._24_8_ = auVar76._24_8_;
  uVar78 = local_c0._24_8_;
  local_c0 = auVar76;
  local_a0 = local_e44;
  local_9c = local_e44;
  local_98 = local_e44;
  local_94 = local_e44;
  local_90 = local_e44;
  local_8c = local_e44;
  local_88 = local_e44;
  local_84 = local_e44;
  auVar67 = auVar76._0_16_;
  auVar83 = auVar76._16_16_;
  for (local_9964 = 0; local_9964 < w + 7; local_9964 = local_9964 + 1) {
    for (local_9968 = 0; local_9968 < y_step_q4; local_9968 = local_9968 + 0x10) {
      uVar61 = (long)local_9968 * 2;
      palVar58 = (__m256i *)(lVar1 + lVar60 + local_9964 * local_1060 * 2 + uVar61);
      yy_loadu_256(palVar58,pvVar64);
      auVar68 = auVar67;
      auVar84 = auVar83;
      yy_loadu_256((__m256i *)((long)*palVar58 + 2),pvVar64);
      auVar69 = auVar68;
      auVar85 = auVar84;
      yy_loadu_256((__m256i *)((long)*palVar58 + 4),pvVar64);
      auVar70 = auVar69;
      auVar86 = auVar85;
      yy_loadu_256((__m256i *)((long)*palVar58 + 6),pvVar64);
      auVar71 = auVar70;
      auVar87 = auVar86;
      yy_loadu_256((__m256i *)(*palVar58 + 1),pvVar64);
      auVar72 = auVar71;
      auVar88 = auVar87;
      yy_loadu_256((__m256i *)((long)*palVar58 + 10),pvVar64);
      auVar73 = auVar72;
      auVar89 = auVar88;
      yy_loadu_256((__m256i *)((long)*palVar58 + 0xc),pvVar64);
      auVar74 = auVar73;
      auVar90 = auVar89;
      yy_loadu_256((__m256i *)((long)*palVar58 + 0xe),pvVar64);
      auVar30._16_8_ = auVar83._0_8_;
      auVar30._0_16_ = auVar67;
      auVar30._24_8_ = auVar83._8_8_;
      auVar29._8_8_ = uStack_9878;
      auVar29._0_8_ = local_9880;
      auVar29._16_8_ = uVar79;
      auVar29._24_8_ = uVar91;
      auVar77 = vpmaddwd_avx2(auVar30,auVar29);
      auVar28._16_8_ = auVar84._0_8_;
      auVar28._0_16_ = auVar68;
      auVar28._24_8_ = auVar84._8_8_;
      auVar27._8_8_ = uStack_9878;
      auVar27._0_8_ = local_9880;
      auVar27._16_8_ = uVar79;
      auVar27._24_8_ = uVar91;
      auVar3 = vpmaddwd_avx2(auVar28,auVar27);
      auVar26._16_8_ = auVar85._0_8_;
      auVar26._0_16_ = auVar69;
      auVar26._24_8_ = auVar85._8_8_;
      auVar25._8_8_ = uStack_9888;
      auVar25._0_8_ = local_9890;
      auVar25._16_8_ = uVar80;
      auVar25._24_8_ = uVar92;
      auVar4 = vpmaddwd_avx2(auVar26,auVar25);
      auVar24._16_8_ = auVar86._0_8_;
      auVar24._0_16_ = auVar70;
      auVar24._24_8_ = auVar86._8_8_;
      auVar23._8_8_ = uStack_9888;
      auVar23._0_8_ = local_9890;
      auVar23._16_8_ = uVar80;
      auVar23._24_8_ = uVar92;
      auVar5 = vpmaddwd_avx2(auVar24,auVar23);
      auVar22._16_8_ = auVar87._0_8_;
      auVar22._0_16_ = auVar71;
      auVar22._24_8_ = auVar87._8_8_;
      auVar21._8_8_ = uStack_9898;
      auVar21._0_8_ = local_98a0;
      auVar21._16_8_ = uVar81;
      auVar21._24_8_ = uVar93;
      auVar6 = vpmaddwd_avx2(auVar22,auVar21);
      auVar20._16_8_ = auVar88._0_8_;
      auVar20._0_16_ = auVar72;
      auVar20._24_8_ = auVar88._8_8_;
      auVar19._8_8_ = uStack_9898;
      auVar19._0_8_ = local_98a0;
      auVar19._16_8_ = uVar81;
      auVar19._24_8_ = uVar93;
      auVar7 = vpmaddwd_avx2(auVar20,auVar19);
      auVar18._16_8_ = auVar89._0_8_;
      auVar18._0_16_ = auVar73;
      auVar18._24_8_ = auVar89._8_8_;
      auVar17._8_8_ = uStack_98a8;
      auVar17._0_8_ = local_98b0;
      auVar17._16_8_ = uVar82;
      auVar17._24_8_ = uVar94;
      auVar8 = vpmaddwd_avx2(auVar18,auVar17);
      auVar16._16_8_ = auVar90._0_8_;
      auVar16._0_16_ = auVar74;
      auVar16._24_8_ = auVar90._8_8_;
      auVar15._8_8_ = uStack_98a8;
      auVar15._0_8_ = local_98b0;
      auVar15._16_8_ = uVar82;
      auVar15._24_8_ = uVar94;
      auVar9 = vpmaddwd_avx2(auVar16,auVar15);
      local_9aa0 = auVar77._0_8_;
      uStack_9a98 = auVar77._8_8_;
      uStack_9a90 = auVar77._16_8_;
      uStack_9a88 = auVar77._24_8_;
      local_9b20 = auVar6._0_8_;
      uStack_9b18 = auVar6._8_8_;
      uStack_9b10 = auVar6._16_8_;
      uStack_9b08 = auVar6._24_8_;
      local_660 = local_9aa0;
      uStack_658 = uStack_9a98;
      uStack_650 = uStack_9a90;
      uStack_648 = uStack_9a88;
      local_680 = local_9b20;
      uStack_678 = uStack_9b18;
      uStack_670 = uStack_9b10;
      uStack_668 = uStack_9b08;
      local_6e0 = vpaddd_avx2(auVar77,auVar6);
      local_9ae0 = auVar4._0_8_;
      uStack_9ad8 = auVar4._8_8_;
      uStack_9ad0 = auVar4._16_8_;
      uStack_9ac8 = auVar4._24_8_;
      local_9b60 = auVar8._0_8_;
      uStack_9b58 = auVar8._8_8_;
      uStack_9b50 = auVar8._16_8_;
      uStack_9b48 = auVar8._24_8_;
      local_6a0 = local_9ae0;
      uStack_698 = uStack_9ad8;
      uStack_690 = uStack_9ad0;
      uStack_688 = uStack_9ac8;
      local_6c0 = local_9b60;
      uStack_6b8 = uStack_9b58;
      uStack_6b0 = uStack_9b50;
      uStack_6a8 = uStack_9b48;
      local_700 = vpaddd_avx2(auVar4,auVar8);
      auVar77 = vpaddd_avx2(local_6e0,local_700);
      local_9ba0 = auVar77._0_8_;
      uStack_9b98 = auVar77._8_8_;
      uStack_9b90 = auVar77._16_8_;
      uStack_9b88 = auVar77._24_8_;
      local_720 = local_9ba0;
      uStack_718 = uStack_9b98;
      uStack_710 = uStack_9b90;
      uStack_708 = uStack_9b88;
      auVar32._16_8_ = uVar66;
      auVar32._0_16_ = auVar76._0_16_;
      auVar32._24_8_ = uVar78;
      local_560 = vpaddd_avx2(auVar77,auVar32);
      local_564 = *(uint *)CONCAT44(in_stack_0000002c,h);
      auVar4 = vpsrad_avx2(local_560,ZEXT416(local_564));
      local_9ac0 = auVar3._0_8_;
      uStack_9ab8 = auVar3._8_8_;
      uStack_9ab0 = auVar3._16_8_;
      uStack_9aa8 = auVar3._24_8_;
      local_9b40 = auVar7._0_8_;
      uStack_9b38 = auVar7._8_8_;
      uStack_9b30 = auVar7._16_8_;
      uStack_9b28 = auVar7._24_8_;
      local_760 = local_9ac0;
      uStack_758 = uStack_9ab8;
      uStack_750 = uStack_9ab0;
      uStack_748 = uStack_9aa8;
      local_780 = local_9b40;
      uStack_778 = uStack_9b38;
      uStack_770 = uStack_9b30;
      uStack_768 = uStack_9b28;
      local_7e0 = vpaddd_avx2(auVar3,auVar7);
      local_9b00 = auVar5._0_8_;
      uStack_9af8 = auVar5._8_8_;
      uStack_9af0 = auVar5._16_8_;
      uStack_9ae8 = auVar5._24_8_;
      local_9b80 = auVar9._0_8_;
      uStack_9b78 = auVar9._8_8_;
      uStack_9b70 = auVar9._16_8_;
      uStack_9b68 = auVar9._24_8_;
      local_7a0 = local_9b00;
      uStack_798 = uStack_9af8;
      uStack_790 = uStack_9af0;
      uStack_788 = uStack_9ae8;
      local_7c0 = local_9b80;
      uStack_7b8 = uStack_9b78;
      uStack_7b0 = uStack_9b70;
      uStack_7a8 = uStack_9b68;
      local_800 = vpaddd_avx2(auVar5,auVar9);
      auVar77 = vpaddd_avx2(local_7e0,local_800);
      local_9be0 = auVar77._0_8_;
      uStack_9bd8 = auVar77._8_8_;
      uStack_9bd0 = auVar77._16_8_;
      uStack_9bc8 = auVar77._24_8_;
      local_820 = local_9be0;
      uStack_818 = uStack_9bd8;
      uStack_810 = uStack_9bd0;
      uStack_808 = uStack_9bc8;
      auVar31._16_8_ = uVar66;
      auVar31._0_16_ = auVar76._0_16_;
      auVar31._24_8_ = uVar78;
      local_5a0 = vpaddd_avx2(auVar77,auVar31);
      local_5a4 = *(uint *)CONCAT44(in_stack_0000002c,h);
      auVar77 = vpsrad_avx2(local_5a0,ZEXT416(local_5a4));
      local_9bc0 = auVar4._0_8_;
      uStack_9bb8 = auVar4._8_8_;
      uStack_9bb0 = auVar4._16_8_;
      uStack_9ba8 = auVar4._24_8_;
      local_9c00 = auVar77._0_8_;
      uStack_9bf8 = auVar77._8_8_;
      uStack_9bf0 = auVar77._16_8_;
      uStack_9be8 = auVar77._24_8_;
      local_4e0 = local_9bc0;
      uStack_4d8 = uStack_9bb8;
      uStack_4d0 = uStack_9bb0;
      uStack_4c8 = uStack_9ba8;
      local_500 = local_9c00;
      uStack_4f8 = uStack_9bf8;
      uStack_4f0 = uStack_9bf0;
      uStack_4e8 = uStack_9be8;
      auVar77 = vpackssdw_avx2(auVar4,auVar77);
      local_9c20 = auVar77._0_8_;
      uStack_9c18 = auVar77._8_8_;
      uStack_9c10 = auVar77._16_8_;
      uStack_9c08 = auVar77._24_8_;
      local_3e0 = local_9c20;
      uStack_3d8 = uStack_9c18;
      uStack_3d0 = uStack_9c10;
      uStack_3c8 = uStack_9c08;
      local_400 = 0;
      uStack_3f8 = uVar50;
      uStack_3f0 = 0;
      uStack_3e8 = 0;
      local_460 = vpmaxsw_avx2(auVar77,ZEXT832((ulong)uVar50) << 0x40);
      local_480 = uVar51;
      uStack_478 = uVar52;
      uStack_470 = uVar53;
      uStack_468 = uVar54;
      auVar33._16_8_ = uVar53;
      auVar33._0_16_ = auVar2;
      auVar33._24_8_ = uVar54;
      auVar77 = vpminsw_avx2(local_460,auVar33);
      local_9c40 = auVar77._0_8_;
      uStack_9c38 = auVar77._8_8_;
      uStack_9c30 = auVar77._16_8_;
      uStack_9c28 = auVar77._24_8_;
      v._8_10_ = in_stack_ffffffffffff5e40;
      v[0] = 0xa4a016;
      v[2]._2_2_ = in_stack_ffffffffffff5e4a;
      v[2]._4_4_ = in_stack_ffffffffffff5e4c;
      v[3]._0_4_ = in_stack_ffffffffffff5e50;
      v[3]._4_2_ = in_stack_ffffffffffff5e54;
      v[3]._6_2_ = uVar55;
      local_c40 = local_98b0;
      uStack_c38 = uStack_98a8;
      uStack_c30 = uVar82;
      uStack_c28 = uVar94;
      local_c00 = local_98b0;
      uStack_bf8 = uStack_98a8;
      uStack_bf0 = uVar82;
      uStack_be8 = uVar94;
      local_bc0 = local_98a0;
      uStack_bb8 = uStack_9898;
      uStack_bb0 = uVar81;
      uStack_ba8 = uVar93;
      local_b80 = local_98a0;
      uStack_b78 = uStack_9898;
      uStack_b70 = uVar81;
      uStack_b68 = uVar93;
      local_b40 = local_9890;
      uStack_b38 = uStack_9888;
      uStack_b30 = uVar80;
      uStack_b28 = uVar92;
      local_b00 = local_9890;
      uStack_af8 = uStack_9888;
      uStack_af0 = uVar80;
      uStack_ae8 = uVar92;
      local_ac0 = local_9880;
      uStack_ab8 = uStack_9878;
      uStack_ab0 = uVar79;
      uStack_aa8 = uVar91;
      local_a80 = local_9880;
      uStack_a78 = uStack_9878;
      uStack_a70 = uVar79;
      uStack_a68 = uVar91;
      local_c20 = auVar74;
      auStack_c10 = auVar90;
      local_740 = auVar76._0_16_;
      auStack_730 = auVar76._16_16_;
      local_a60 = auVar67;
      auStack_a50 = auVar83;
      local_aa0 = auVar68;
      auStack_a90 = auVar84;
      local_ae0 = auVar69;
      auStack_ad0 = auVar85;
      local_b20 = auVar70;
      auStack_b10 = auVar86;
      local_b60 = auVar71;
      auStack_b50 = auVar87;
      local_ba0 = auVar72;
      auStack_b90 = auVar88;
      local_be0 = auVar73;
      auStack_bd0 = auVar89;
      local_840 = auVar76._0_16_;
      auStack_830 = auVar76._16_16_;
      yy_storeu_256(local_a1a0,v);
      auVar83._8_8_ = uStack_9c28;
      auVar83._0_8_ = uStack_9c30;
      auVar67._8_8_ = uStack_9c38;
      auVar67._0_8_ = local_9c40;
    }
  }
  lVar62 = CONCAT71((int7)(uVar61 >> 8),bVar10);
  iVar96 = 1;
  uVar56 = (short)(1 << (bVar10 & 0x1f)) - 1;
  auVar68 = vpinsrw_avx(ZEXT216(uVar56),(uint)uVar56,1);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar56,2);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar56,3);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar56,4);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar56,5);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar56,6);
  auVar2 = vpinsrw_avx(auVar68,(uint)uVar56,7);
  auVar68 = vpinsrw_avx(ZEXT216(uVar56),(uint)uVar56,1);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar56,2);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar56,3);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar56,4);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar56,5);
  auVar68 = vpinsrw_avx(auVar68,(uint)uVar56,6);
  auStack_f0 = vpinsrw_avx(auVar68,(uint)uVar56,7);
  local_100._0_8_ = auVar2._0_8_;
  uVar51 = local_100._0_8_;
  local_100._8_8_ = auVar2._8_8_;
  uVar52 = local_100._8_8_;
  uVar53 = auStack_f0._0_8_;
  uVar54 = auStack_f0._8_8_;
  uVar66 = local_100._0_8_;
  uVar78 = local_100._8_8_;
  local_1014 = uVar56;
  local_100 = auVar2;
  local_e0 = uVar56;
  local_de = uVar56;
  local_dc = uVar56;
  local_da = uVar56;
  local_d8 = uVar56;
  local_d6 = uVar56;
  local_d4 = uVar56;
  local_d2 = uVar56;
  local_d0 = uVar56;
  local_ce = uVar56;
  local_cc = uVar56;
  local_ca = uVar56;
  local_c8 = uVar56;
  local_c6 = uVar56;
  local_c4 = uVar56;
  local_c2 = uVar56;
  alVar95 = xx_loadu_128(in_stack_00000008);
  hi_03[1] = alVar95[1];
  local_1010 = local_97f0;
  uStack_1008 = uStack_97e8;
  auVar84._8_8_ = uVar78;
  auVar84._0_8_ = uVar66;
  auVar68 = vpaddw_avx(auVar84,auVar75);
  local_9c70 = auVar68._0_8_;
  uStack_9c68 = auVar68._8_8_;
  local_fc0 = local_9c70;
  uStack_fb8 = uStack_9c68;
  local_fd0 = local_9c70;
  uStack_fc8 = uStack_9c68;
  auVar67 = vpunpckldq_avx(auVar68,auVar68);
  local_f80 = local_9c70;
  uStack_f78 = uStack_9c68;
  local_f90 = local_9c70;
  uStack_f88 = uStack_9c68;
  auVar68 = vpunpckhdq_avx(auVar68,auVar68);
  local_9c80 = auVar67._0_8_;
  uStack_9c78 = auVar67._8_8_;
  local_f20 = local_9c80;
  uStack_f18 = uStack_9c78;
  local_f30 = local_9c80;
  uStack_f28 = uStack_9c78;
  auVar75 = vpunpcklqdq_avx(auVar67,auVar67);
  local_ea0 = local_9c80;
  uStack_e98 = uStack_9c78;
  local_eb0 = local_9c80;
  uStack_ea8 = uStack_9c78;
  auVar67 = vpunpckhqdq_avx(auVar67,auVar67);
  local_9c90 = auVar68._0_8_;
  uStack_9c88 = auVar68._8_8_;
  local_f40 = local_9c90;
  uStack_f38 = uStack_9c88;
  local_f50 = local_9c90;
  uStack_f48 = uStack_9c88;
  auVar83 = vpunpcklqdq_avx(auVar68,auVar68);
  local_ec0 = local_9c90;
  uStack_eb8 = uStack_9c88;
  local_ed0 = local_9c90;
  uStack_ec8 = uStack_9c88;
  auVar68 = vpunpckhqdq_avx(auVar68,auVar68);
  local_9ca0 = auVar75._0_8_;
  uStack_9c98 = auVar75._8_8_;
  uVar79 = 0;
  uVar91 = 0;
  lo_02[1] = uVar65;
  lo_02[0] = lVar62;
  hi_03[0] = (longlong)pvVar64;
  local_1000 = uVar66;
  uStack_ff8 = uVar78;
  yy_set_m128i(in_stack_00000008,hi_03,lo_02);
  local_9cb0 = auVar67._0_8_;
  uStack_9ca8 = auVar67._8_8_;
  uVar80 = 0;
  uVar92 = 0;
  lo_03[1] = uVar65;
  lo_03[0] = lVar62;
  hi_04[1] = extraout_RDX_02;
  hi_04[0] = (longlong)pvVar64;
  yy_set_m128i(in_stack_00000008,hi_04,lo_03);
  local_9cc0 = auVar83._0_8_;
  uStack_9cb8 = auVar83._8_8_;
  uVar81 = 0;
  uVar93 = 0;
  lo_04[1] = uVar65;
  lo_04[0] = lVar62;
  hi_05[1] = extraout_RDX_03;
  hi_05[0] = (longlong)pvVar64;
  yy_set_m128i(in_stack_00000008,hi_05,lo_04);
  local_9cd0 = auVar68._0_8_;
  uStack_9cc8 = auVar68._8_8_;
  uVar82 = 0;
  uVar94 = 0;
  lo_05[1] = uVar65;
  lo_05[0] = lVar62;
  hi_06[1] = extraout_RDX_04;
  hi_06[0] = (longlong)pvVar64;
  yy_set_m128i(in_stack_00000008,hi_06,lo_05);
  cVar63 = (char)*(undefined4 *)(CONCAT44(in_stack_0000002c,h) + 4);
  uVar57 = (iVar96 << (cVar63 - 1U & 0x1f)) - (iVar96 << ((bVar10 + cVar63) - 1 & 0x1f));
  pvVar64 = (void *)(ulong)uVar57;
  auVar68 = vpinsrd_avx(ZEXT416(uVar57),uVar57,1);
  auVar68 = vpinsrd_avx(auVar68,uVar57,2);
  auVar68 = vpinsrd_avx(auVar68,uVar57,3);
  auVar67 = vpinsrd_avx(ZEXT416(uVar57),uVar57,1);
  auVar67 = vpinsrd_avx(auVar67,uVar57,2);
  auVar67 = vpinsrd_avx(auVar67,uVar57,3);
  auVar77._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar67;
  auVar77._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68;
  local_80._16_8_ = auVar77._16_8_;
  uVar66 = local_80._16_8_;
  local_80._24_8_ = auVar77._24_8_;
  uVar78 = local_80._24_8_;
  local_e48 = uVar57;
  local_80 = auVar77;
  local_50 = uVar57;
  local_4c = uVar57;
  local_48 = uVar57;
  local_44 = uVar57;
  local_40 = uVar57;
  local_3c = uVar57;
  local_38 = uVar57;
  local_34 = uVar57;
  auVar75 = auVar77._0_16_;
  auVar69 = auVar77._16_16_;
  for (local_9d84 = 0; local_9d84 < w; local_9d84 = local_9d84 + 1) {
    for (local_9d88 = 0; local_9d88 < y_step_q4; local_9d88 = local_9d88 + 0x10) {
      palVar58 = (__m256i *)((long)local_97a0 + (long)local_9d88 * 2 + (long)(local_9d84 << 7) * 2);
      yy_loadu_256(palVar58,pvVar64);
      auVar68 = auVar75;
      auVar67 = auVar69;
      yy_loadu_256(palVar58 + 8,pvVar64);
      auVar83 = auVar68;
      auVar84 = auVar67;
      yy_loadu_256(palVar58 + 0x10,pvVar64);
      auVar85 = auVar83;
      auVar70 = auVar84;
      yy_loadu_256(palVar58 + 0x18,pvVar64);
      auVar86 = auVar85;
      auVar71 = auVar70;
      yy_loadu_256(palVar58 + 0x20,pvVar64);
      auVar87 = auVar86;
      auVar72 = auVar71;
      yy_loadu_256(palVar58 + 0x28,pvVar64);
      auVar88 = auVar87;
      auVar73 = auVar72;
      yy_loadu_256(palVar58 + 0x30,pvVar64);
      auVar89 = auVar88;
      auVar74 = auVar73;
      yy_loadu_256(palVar58 + 0x38,pvVar64);
      auVar41._16_8_ = auVar69._0_8_;
      auVar41._0_16_ = auVar75;
      auVar41._24_8_ = auVar69._8_8_;
      auVar40._16_8_ = auVar67._0_8_;
      auVar40._0_16_ = auVar68;
      auVar40._24_8_ = auVar67._8_8_;
      auVar76 = vpunpcklwd_avx2(auVar41,auVar40);
      auVar39._16_8_ = auVar84._0_8_;
      auVar39._0_16_ = auVar83;
      auVar39._24_8_ = auVar84._8_8_;
      auVar38._16_8_ = auVar70._0_8_;
      auVar38._0_16_ = auVar85;
      auVar38._24_8_ = auVar70._8_8_;
      auVar3 = vpunpcklwd_avx2(auVar39,auVar38);
      auVar37._16_8_ = auVar71._0_8_;
      auVar37._0_16_ = auVar86;
      auVar37._24_8_ = auVar71._8_8_;
      auVar36._16_8_ = auVar72._0_8_;
      auVar36._0_16_ = auVar87;
      auVar36._24_8_ = auVar72._8_8_;
      auVar4 = vpunpcklwd_avx2(auVar37,auVar36);
      auVar35._16_8_ = auVar73._0_8_;
      auVar35._0_16_ = auVar88;
      auVar35._24_8_ = auVar73._8_8_;
      auVar34._16_8_ = auVar74._0_8_;
      auVar34._0_16_ = auVar89;
      auVar34._24_8_ = auVar74._8_8_;
      auVar5 = vpunpcklwd_avx2(auVar35,auVar34);
      local_9ec0 = auVar76._0_8_;
      uStack_9eb8 = auVar76._8_8_;
      uStack_9eb0 = auVar76._16_8_;
      uStack_9ea8 = auVar76._24_8_;
      local_c60 = local_9ec0;
      uStack_c58 = uStack_9eb8;
      uStack_c50 = uStack_9eb0;
      uStack_c48 = uStack_9ea8;
      auVar14._8_8_ = uStack_9c98;
      auVar14._0_8_ = local_9ca0;
      auVar14._16_8_ = uVar79;
      auVar14._24_8_ = uVar91;
      auVar76 = vpmaddwd_avx2(auVar76,auVar14);
      local_9ee0 = auVar3._0_8_;
      uStack_9ed8 = auVar3._8_8_;
      uStack_9ed0 = auVar3._16_8_;
      uStack_9ec8 = auVar3._24_8_;
      local_ca0 = local_9ee0;
      uStack_c98 = uStack_9ed8;
      uStack_c90 = uStack_9ed0;
      uStack_c88 = uStack_9ec8;
      auVar13._8_8_ = uStack_9ca8;
      auVar13._0_8_ = local_9cb0;
      auVar13._16_8_ = uVar80;
      auVar13._24_8_ = uVar92;
      auVar3 = vpmaddwd_avx2(auVar3,auVar13);
      local_9f00 = auVar4._0_8_;
      uStack_9ef8 = auVar4._8_8_;
      uStack_9ef0 = auVar4._16_8_;
      uStack_9ee8 = auVar4._24_8_;
      local_ce0 = local_9f00;
      uStack_cd8 = uStack_9ef8;
      uStack_cd0 = uStack_9ef0;
      uStack_cc8 = uStack_9ee8;
      auVar12._8_8_ = uStack_9cb8;
      auVar12._0_8_ = local_9cc0;
      auVar12._16_8_ = uVar81;
      auVar12._24_8_ = uVar93;
      auVar4 = vpmaddwd_avx2(auVar4,auVar12);
      local_9f20 = auVar5._0_8_;
      uStack_9f18 = auVar5._8_8_;
      uStack_9f10 = auVar5._16_8_;
      uStack_9f08 = auVar5._24_8_;
      local_d20 = local_9f20;
      uStack_d18 = uStack_9f18;
      uStack_d10 = uStack_9f10;
      uStack_d08 = uStack_9f08;
      auVar6._8_8_ = uStack_9cc8;
      auVar6._0_8_ = local_9cd0;
      auVar6._16_8_ = uVar82;
      auVar6._24_8_ = uVar94;
      auVar5 = vpmaddwd_avx2(auVar5,auVar6);
      local_9f40 = auVar76._0_8_;
      uStack_9f38 = auVar76._8_8_;
      uStack_9f30 = auVar76._16_8_;
      uStack_9f28 = auVar76._24_8_;
      local_9f60 = auVar3._0_8_;
      uStack_9f58 = auVar3._8_8_;
      uStack_9f50 = auVar3._16_8_;
      uStack_9f48 = auVar3._24_8_;
      local_860 = local_9f40;
      uStack_858 = uStack_9f38;
      uStack_850 = uStack_9f30;
      uStack_848 = uStack_9f28;
      local_880 = local_9f60;
      uStack_878 = uStack_9f58;
      uStack_870 = uStack_9f50;
      uStack_868 = uStack_9f48;
      local_8e0 = vpaddd_avx2(auVar76,auVar3);
      local_9f80 = auVar4._0_8_;
      uStack_9f78 = auVar4._8_8_;
      uStack_9f70 = auVar4._16_8_;
      uStack_9f68 = auVar4._24_8_;
      local_9fa0 = auVar5._0_8_;
      uStack_9f98 = auVar5._8_8_;
      uStack_9f90 = auVar5._16_8_;
      uStack_9f88 = auVar5._24_8_;
      local_8a0 = local_9f80;
      uStack_898 = uStack_9f78;
      uStack_890 = uStack_9f70;
      uStack_888 = uStack_9f68;
      local_8c0 = local_9fa0;
      uStack_8b8 = uStack_9f98;
      uStack_8b0 = uStack_9f90;
      uStack_8a8 = uStack_9f88;
      local_900 = vpaddd_avx2(auVar4,auVar5);
      auVar76 = vpaddd_avx2(local_8e0,local_900);
      auVar49._16_8_ = auVar69._0_8_;
      auVar49._0_16_ = auVar75;
      auVar49._24_8_ = auVar69._8_8_;
      auVar48._16_8_ = auVar67._0_8_;
      auVar48._0_16_ = auVar68;
      auVar48._24_8_ = auVar67._8_8_;
      auVar3 = vpunpckhwd_avx2(auVar49,auVar48);
      auVar47._16_8_ = auVar84._0_8_;
      auVar47._0_16_ = auVar83;
      auVar47._24_8_ = auVar84._8_8_;
      auVar46._16_8_ = auVar70._0_8_;
      auVar46._0_16_ = auVar85;
      auVar46._24_8_ = auVar70._8_8_;
      auVar4 = vpunpckhwd_avx2(auVar47,auVar46);
      auVar45._16_8_ = auVar71._0_8_;
      auVar45._0_16_ = auVar86;
      auVar45._24_8_ = auVar71._8_8_;
      auVar44._16_8_ = auVar72._0_8_;
      auVar44._0_16_ = auVar87;
      auVar44._24_8_ = auVar72._8_8_;
      auVar5 = vpunpckhwd_avx2(auVar45,auVar44);
      auVar43._16_8_ = auVar73._0_8_;
      auVar43._0_16_ = auVar88;
      auVar43._24_8_ = auVar73._8_8_;
      auVar42._16_8_ = auVar74._0_8_;
      auVar42._0_16_ = auVar89;
      auVar42._24_8_ = auVar74._8_8_;
      auVar6 = vpunpckhwd_avx2(auVar43,auVar42);
      local_9fe0 = auVar3._0_8_;
      uStack_9fd8 = auVar3._8_8_;
      uStack_9fd0 = auVar3._16_8_;
      uStack_9fc8 = auVar3._24_8_;
      local_d60 = local_9fe0;
      uStack_d58 = uStack_9fd8;
      uStack_d50 = uStack_9fd0;
      uStack_d48 = uStack_9fc8;
      auVar11._8_8_ = uStack_9c98;
      auVar11._0_8_ = local_9ca0;
      auVar11._16_8_ = uVar79;
      auVar11._24_8_ = uVar91;
      auVar3 = vpmaddwd_avx2(auVar3,auVar11);
      local_a000 = auVar4._0_8_;
      uStack_9ff8 = auVar4._8_8_;
      uStack_9ff0 = auVar4._16_8_;
      uStack_9fe8 = auVar4._24_8_;
      local_da0 = local_a000;
      uStack_d98 = uStack_9ff8;
      uStack_d90 = uStack_9ff0;
      uStack_d88 = uStack_9fe8;
      auVar9._8_8_ = uStack_9ca8;
      auVar9._0_8_ = local_9cb0;
      auVar9._16_8_ = uVar80;
      auVar9._24_8_ = uVar92;
      auVar4 = vpmaddwd_avx2(auVar4,auVar9);
      local_a020 = auVar5._0_8_;
      uStack_a018 = auVar5._8_8_;
      uStack_a010 = auVar5._16_8_;
      uStack_a008 = auVar5._24_8_;
      local_de0 = local_a020;
      uStack_dd8 = uStack_a018;
      uStack_dd0 = uStack_a010;
      uStack_dc8 = uStack_a008;
      auVar8._8_8_ = uStack_9cb8;
      auVar8._0_8_ = local_9cc0;
      auVar8._16_8_ = uVar81;
      auVar8._24_8_ = uVar93;
      auVar5 = vpmaddwd_avx2(auVar5,auVar8);
      local_a040 = auVar6._0_8_;
      uStack_a038 = auVar6._8_8_;
      uStack_a030 = auVar6._16_8_;
      uStack_a028 = auVar6._24_8_;
      local_e20 = local_a040;
      uStack_e18 = uStack_a038;
      uStack_e10 = uStack_a030;
      uStack_e08 = uStack_a028;
      auVar7._8_8_ = uStack_9cc8;
      auVar7._0_8_ = local_9cd0;
      auVar7._16_8_ = uVar82;
      auVar7._24_8_ = uVar94;
      auVar6 = vpmaddwd_avx2(auVar6,auVar7);
      local_a060 = auVar3._0_8_;
      uStack_a058 = auVar3._8_8_;
      uStack_a050 = auVar3._16_8_;
      uStack_a048 = auVar3._24_8_;
      local_a080 = auVar4._0_8_;
      uStack_a078 = auVar4._8_8_;
      uStack_a070 = auVar4._16_8_;
      uStack_a068 = auVar4._24_8_;
      local_920 = local_a060;
      uStack_918 = uStack_a058;
      uStack_910 = uStack_a050;
      uStack_908 = uStack_a048;
      local_940 = local_a080;
      uStack_938 = uStack_a078;
      uStack_930 = uStack_a070;
      uStack_928 = uStack_a068;
      local_9a0 = vpaddd_avx2(auVar3,auVar4);
      local_a0a0 = auVar5._0_8_;
      uStack_a098 = auVar5._8_8_;
      uStack_a090 = auVar5._16_8_;
      uStack_a088 = auVar5._24_8_;
      local_a0c0 = auVar6._0_8_;
      uStack_a0b8 = auVar6._8_8_;
      uStack_a0b0 = auVar6._16_8_;
      uStack_a0a8 = auVar6._24_8_;
      local_960 = local_a0a0;
      uStack_958 = uStack_a098;
      uStack_950 = uStack_a090;
      uStack_948 = uStack_a088;
      local_980 = local_a0c0;
      uStack_978 = uStack_a0b8;
      uStack_970 = uStack_a0b0;
      uStack_968 = uStack_a0a8;
      local_9c0 = vpaddd_avx2(auVar5,auVar6);
      auVar3 = vpaddd_avx2(local_9a0,local_9c0);
      local_9fc0 = auVar76._0_8_;
      uStack_9fb8 = auVar76._8_8_;
      uStack_9fb0 = auVar76._16_8_;
      uStack_9fa8 = auVar76._24_8_;
      local_a0e0 = auVar3._0_8_;
      uStack_a0d8 = auVar3._8_8_;
      uStack_a0d0 = auVar3._16_8_;
      uStack_a0c8 = auVar3._24_8_;
      local_1a0 = local_9fc0;
      uStack_198 = uStack_9fb8;
      uStack_190 = uStack_9fb0;
      uStack_188 = uStack_9fa8;
      local_1c0 = local_a0e0;
      uStack_1b8 = uStack_a0d8;
      uStack_1b0 = uStack_a0d0;
      uStack_1a8 = uStack_a0c8;
      auVar4 = vpunpckldq_avx2(auVar76,auVar3);
      local_160 = local_9fc0;
      uStack_158 = uStack_9fb8;
      uStack_150 = uStack_9fb0;
      uStack_148 = uStack_9fa8;
      local_180 = local_a0e0;
      uStack_178 = uStack_a0d8;
      uStack_170 = uStack_a0d0;
      uStack_168 = uStack_a0c8;
      auVar3 = vpunpckhdq_avx2(auVar76,auVar3);
      local_a100 = auVar4._0_8_;
      uStack_a0f8 = auVar4._8_8_;
      uStack_a0f0 = auVar4._16_8_;
      uStack_a0e8 = auVar4._24_8_;
      local_9e0 = local_a100;
      uStack_9d8 = uStack_a0f8;
      uStack_9d0 = uStack_a0f0;
      uStack_9c8 = uStack_a0e8;
      auVar5._16_8_ = uVar66;
      auVar5._0_16_ = auVar77._0_16_;
      auVar5._24_8_ = uVar78;
      local_5e0 = vpaddd_avx2(auVar4,auVar5);
      local_5e4 = *(uint *)(CONCAT44(in_stack_0000002c,h) + 4);
      auVar76 = vpsrad_avx2(local_5e0,ZEXT416(local_5e4));
      local_a120 = auVar3._0_8_;
      uStack_a118 = auVar3._8_8_;
      uStack_a110 = auVar3._16_8_;
      uStack_a108 = auVar3._24_8_;
      local_a20 = local_a120;
      uStack_a18 = uStack_a118;
      uStack_a10 = uStack_a110;
      uStack_a08 = uStack_a108;
      auVar4._16_8_ = uVar66;
      auVar4._0_16_ = auVar77._0_16_;
      auVar4._24_8_ = uVar78;
      local_620 = vpaddd_avx2(auVar3,auVar4);
      local_624 = *(uint *)(CONCAT44(in_stack_0000002c,h) + 4);
      auVar3 = vpsrad_avx2(local_620,ZEXT416(local_624));
      local_a140 = auVar76._0_8_;
      uStack_a138 = auVar76._8_8_;
      uStack_a130 = auVar76._16_8_;
      uStack_a128 = auVar76._24_8_;
      local_a160 = auVar3._0_8_;
      uStack_a158 = auVar3._8_8_;
      uStack_a150 = auVar3._16_8_;
      uStack_a148 = auVar3._24_8_;
      local_520 = local_a140;
      uStack_518 = uStack_a138;
      uStack_510 = uStack_a130;
      uStack_508 = uStack_a128;
      local_540 = local_a160;
      uStack_538 = uStack_a158;
      uStack_530 = uStack_a150;
      uStack_528 = uStack_a148;
      auVar76 = vpackssdw_avx2(auVar76,auVar3);
      local_a180 = auVar76._0_8_;
      uStack_a178 = auVar76._8_8_;
      uStack_a170 = auVar76._16_8_;
      uStack_a168 = auVar76._24_8_;
      local_420 = local_a180;
      uStack_418 = uStack_a178;
      uStack_410 = uStack_a170;
      uStack_408 = uStack_a168;
      local_440 = 0;
      uStack_438 = uVar50;
      uStack_430 = 0;
      uStack_428 = 0;
      local_4a0 = vpmaxsw_avx2(auVar76,ZEXT832((ulong)uVar50) << 0x40);
      local_4c0 = uVar51;
      uStack_4b8 = uVar52;
      uStack_4b0 = uVar53;
      uStack_4a8 = uVar54;
      auVar3._16_8_ = uVar53;
      auVar3._0_16_ = auVar2;
      auVar3._24_8_ = uVar54;
      auVar76 = vpminsw_avx2(local_4a0,auVar3);
      local_a1a0 = auVar76._0_8_;
      uStack_a198 = auVar76._8_8_;
      a = auVar76._16_8_;
      uStack_a188 = auVar76._24_8_;
      v_00._8_10_ = in_stack_ffffffffffff5e40;
      v_00[0] = 0xa4ade1;
      v_00[2]._2_2_ = uVar56;
      v_00[2]._4_4_ = iVar96;
      v_00[3]._0_4_ = uVar57;
      v_00[3]._4_2_ = in_stack_ffffffffffff5e54;
      v_00[3]._6_2_ = uVar55;
      local_e40 = local_9cd0;
      uStack_e38 = uStack_9cc8;
      uStack_e30 = uVar82;
      uStack_e28 = uVar94;
      local_e00 = local_9cc0;
      uStack_df8 = uStack_9cb8;
      uStack_df0 = uVar81;
      uStack_de8 = uVar93;
      local_dc0 = local_9cb0;
      uStack_db8 = uStack_9ca8;
      uStack_db0 = uVar80;
      uStack_da8 = uVar92;
      local_d80 = local_9ca0;
      uStack_d78 = uStack_9c98;
      uStack_d70 = uVar79;
      uStack_d68 = uVar91;
      local_d40 = local_9cd0;
      uStack_d38 = uStack_9cc8;
      uStack_d30 = uVar82;
      uStack_d28 = uVar94;
      local_d00 = local_9cc0;
      uStack_cf8 = uStack_9cb8;
      uStack_cf0 = uVar81;
      uStack_ce8 = uVar93;
      local_cc0 = local_9cb0;
      uStack_cb8 = uStack_9ca8;
      uStack_cb0 = uVar80;
      uStack_ca8 = uVar92;
      local_c80 = local_9ca0;
      uStack_c78 = uStack_9c98;
      uStack_c70 = uVar79;
      uStack_c68 = uVar91;
      local_3c0 = auVar89;
      auStack_3b0 = auVar74;
      local_a00 = auVar77._0_16_;
      auStack_9f0 = auVar77._16_16_;
      local_2e0 = auVar75;
      auStack_2d0 = auVar69;
      local_300 = auVar68;
      auStack_2f0 = auVar67;
      local_320 = auVar83;
      auStack_310 = auVar84;
      local_340 = auVar85;
      auStack_330 = auVar70;
      local_360 = auVar86;
      auStack_350 = auVar71;
      local_380 = auVar87;
      auStack_370 = auVar72;
      local_3a0 = auVar88;
      auStack_390 = auVar73;
      local_2c0 = auVar89;
      auStack_2b0 = auVar74;
      local_a40 = auVar77._0_16_;
      auStack_a30 = auVar77._16_16_;
      local_1e0 = auVar75;
      auStack_1d0 = auVar69;
      local_200 = auVar68;
      auStack_1f0 = auVar67;
      local_220 = auVar83;
      auStack_210 = auVar84;
      local_240 = auVar85;
      auStack_230 = auVar70;
      local_260 = auVar86;
      auStack_250 = auVar71;
      local_280 = auVar87;
      auStack_270 = auVar72;
      local_2a0 = auVar88;
      auStack_290 = auVar73;
      yy_storeu_256(a,v_00);
      auVar69._8_8_ = uStack_a188;
      auVar69._0_8_ = a;
      auVar75._8_8_ = uStack_a198;
      auVar75._0_8_ = local_a1a0;
    }
  }
  return;
}

Assistant:

void av1_highbd_wiener_convolve_add_src_avx2(
    const uint8_t *src8, ptrdiff_t src_stride, uint8_t *dst8,
    ptrdiff_t dst_stride, const int16_t *filter_x, int x_step_q4,
    const int16_t *filter_y, int y_step_q4, int w, int h,
    const WienerConvolveParams *conv_params, int bd) {
  assert(x_step_q4 == 16 && y_step_q4 == 16);
  assert(!(w & 7));
  assert(bd + FILTER_BITS - conv_params->round_0 + 2 <= 16);
  (void)x_step_q4;
  (void)y_step_q4;

  const uint16_t *const src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *const dst = CONVERT_TO_SHORTPTR(dst8);

  DECLARE_ALIGNED(32, uint16_t,
                  temp[(MAX_SB_SIZE + SUBPEL_TAPS - 1) * MAX_SB_SIZE]);
  int intermediate_height = h + SUBPEL_TAPS - 1;
  const int center_tap = ((SUBPEL_TAPS - 1) / 2);
  const uint16_t *const src_ptr = src - center_tap * src_stride - center_tap;

  const __m128i zero_128 = _mm_setzero_si128();
  const __m256i zero_256 = _mm256_setzero_si256();

  // Add an offset to account for the "add_src" part of the convolve function.
  const __m128i offset = _mm_insert_epi16(zero_128, 1 << FILTER_BITS, 3);

  const __m256i clamp_low = zero_256;

  /* Horizontal filter */
  {
    const __m256i clamp_high_ep =
        _mm256_set1_epi16(WIENER_CLAMP_LIMIT(conv_params->round_0, bd) - 1);

    // coeffs [ f7 f6 f5 f4 f3 f2 f1 f0 ]
    const __m128i coeffs_x = _mm_add_epi16(xx_loadu_128(filter_x), offset);

    // coeffs [ f3 f2 f3 f2 f1 f0 f1 f0 ]
    const __m128i coeffs_0123 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs [ f7 f6 f7 f6 f5 f4 f5 f4 ]
    const __m128i coeffs_4567 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs [ f1 f0 f1 f0 f1 f0 f1 f0 ]
    const __m128i coeffs_01_128 = _mm_unpacklo_epi64(coeffs_0123, coeffs_0123);
    // coeffs [ f3 f2 f3 f2 f3 f2 f3 f2 ]
    const __m128i coeffs_23_128 = _mm_unpackhi_epi64(coeffs_0123, coeffs_0123);
    // coeffs [ f5 f4 f5 f4 f5 f4 f5 f4 ]
    const __m128i coeffs_45_128 = _mm_unpacklo_epi64(coeffs_4567, coeffs_4567);
    // coeffs [ f7 f6 f7 f6 f7 f6 f7 f6 ]
    const __m128i coeffs_67_128 = _mm_unpackhi_epi64(coeffs_4567, coeffs_4567);

    // coeffs [ f1 f0 f1 f0 f1 f0 f1 f0 ][ f1 f0 f1 f0 f1 f0 f1 f0 ]
    const __m256i coeffs_01 = yy_set_m128i(coeffs_01_128, coeffs_01_128);
    // coeffs [ f3 f2 f3 f2 f3 f2 f3 f2 ][ f3 f2 f3 f2 f3 f2 f3 f2 ]
    const __m256i coeffs_23 = yy_set_m128i(coeffs_23_128, coeffs_23_128);
    // coeffs [ f5 f4 f5 f4 f5 f4 f5 f4 ][ f5 f4 f5 f4 f5 f4 f5 f4 ]
    const __m256i coeffs_45 = yy_set_m128i(coeffs_45_128, coeffs_45_128);
    // coeffs [ f7 f6 f7 f6 f7 f6 f7 f6 ][ f7 f6 f7 f6 f7 f6 f7 f6 ]
    const __m256i coeffs_67 = yy_set_m128i(coeffs_67_128, coeffs_67_128);

    const __m256i round_const = _mm256_set1_epi32(
        (1 << (conv_params->round_0 - 1)) + (1 << (bd + FILTER_BITS - 1)));

    for (int i = 0; i < intermediate_height; ++i) {
      for (int j = 0; j < w; j += 16) {
        const uint16_t *src_ij = src_ptr + i * src_stride + j;

        // Load 16-bit src data
        const __m256i src_0 = yy_loadu_256(src_ij + 0);
        const __m256i src_1 = yy_loadu_256(src_ij + 1);
        const __m256i src_2 = yy_loadu_256(src_ij + 2);
        const __m256i src_3 = yy_loadu_256(src_ij + 3);
        const __m256i src_4 = yy_loadu_256(src_ij + 4);
        const __m256i src_5 = yy_loadu_256(src_ij + 5);
        const __m256i src_6 = yy_loadu_256(src_ij + 6);
        const __m256i src_7 = yy_loadu_256(src_ij + 7);

        // Multiply src data by filter coeffs and sum pairs
        const __m256i res_0 = _mm256_madd_epi16(src_0, coeffs_01);
        const __m256i res_1 = _mm256_madd_epi16(src_1, coeffs_01);
        const __m256i res_2 = _mm256_madd_epi16(src_2, coeffs_23);
        const __m256i res_3 = _mm256_madd_epi16(src_3, coeffs_23);
        const __m256i res_4 = _mm256_madd_epi16(src_4, coeffs_45);
        const __m256i res_5 = _mm256_madd_epi16(src_5, coeffs_45);
        const __m256i res_6 = _mm256_madd_epi16(src_6, coeffs_67);
        const __m256i res_7 = _mm256_madd_epi16(src_7, coeffs_67);

        // Calculate scalar product for even- and odd-indices separately,
        // increasing to 32-bit precision
        const __m256i res_even_sum = _mm256_add_epi32(
            _mm256_add_epi32(res_0, res_4), _mm256_add_epi32(res_2, res_6));
        const __m256i res_even = _mm256_srai_epi32(
            _mm256_add_epi32(res_even_sum, round_const), conv_params->round_0);

        const __m256i res_odd_sum = _mm256_add_epi32(
            _mm256_add_epi32(res_1, res_5), _mm256_add_epi32(res_3, res_7));
        const __m256i res_odd = _mm256_srai_epi32(
            _mm256_add_epi32(res_odd_sum, round_const), conv_params->round_0);

        // Reduce to 16-bit precision and pack even- and odd-index results
        // back into one register. The _mm256_packs_epi32 intrinsic returns
        // a register with the pixels ordered as follows:
        // [ 15 13 11 9 14 12 10 8 ] [ 7 5 3 1 6 4 2 0 ]
        const __m256i res = _mm256_packs_epi32(res_even, res_odd);
        const __m256i res_clamped =
            _mm256_min_epi16(_mm256_max_epi16(res, clamp_low), clamp_high_ep);

        // Store in a temporary array
        yy_storeu_256(temp + i * MAX_SB_SIZE + j, res_clamped);
      }
    }
  }

  /* Vertical filter */
  {
    const __m256i clamp_high = _mm256_set1_epi16((1 << bd) - 1);

    // coeffs [ f7 f6 f5 f4 f3 f2 f1 f0 ]
    const __m128i coeffs_y = _mm_add_epi16(xx_loadu_128(filter_y), offset);

    // coeffs [ f3 f2 f3 f2 f1 f0 f1 f0 ]
    const __m128i coeffs_0123 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs [ f7 f6 f7 f6 f5 f4 f5 f4 ]
    const __m128i coeffs_4567 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs [ f1 f0 f1 f0 f1 f0 f1 f0 ]
    const __m128i coeffs_01_128 = _mm_unpacklo_epi64(coeffs_0123, coeffs_0123);
    // coeffs [ f3 f2 f3 f2 f3 f2 f3 f2 ]
    const __m128i coeffs_23_128 = _mm_unpackhi_epi64(coeffs_0123, coeffs_0123);
    // coeffs [ f5 f4 f5 f4 f5 f4 f5 f4 ]
    const __m128i coeffs_45_128 = _mm_unpacklo_epi64(coeffs_4567, coeffs_4567);
    // coeffs [ f7 f6 f7 f6 f7 f6 f7 f6 ]
    const __m128i coeffs_67_128 = _mm_unpackhi_epi64(coeffs_4567, coeffs_4567);

    // coeffs [ f1 f0 f1 f0 f1 f0 f1 f0 ][ f1 f0 f1 f0 f1 f0 f1 f0 ]
    const __m256i coeffs_01 = yy_set_m128i(coeffs_01_128, coeffs_01_128);
    // coeffs [ f3 f2 f3 f2 f3 f2 f3 f2 ][ f3 f2 f3 f2 f3 f2 f3 f2 ]
    const __m256i coeffs_23 = yy_set_m128i(coeffs_23_128, coeffs_23_128);
    // coeffs [ f5 f4 f5 f4 f5 f4 f5 f4 ][ f5 f4 f5 f4 f5 f4 f5 f4 ]
    const __m256i coeffs_45 = yy_set_m128i(coeffs_45_128, coeffs_45_128);
    // coeffs [ f7 f6 f7 f6 f7 f6 f7 f6 ][ f7 f6 f7 f6 f7 f6 f7 f6 ]
    const __m256i coeffs_67 = yy_set_m128i(coeffs_67_128, coeffs_67_128);

    const __m256i round_const =
        _mm256_set1_epi32((1 << (conv_params->round_1 - 1)) -
                          (1 << (bd + conv_params->round_1 - 1)));

    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; j += 16) {
        const uint16_t *temp_ij = temp + i * MAX_SB_SIZE + j;

        // Load 16-bit data from the output of the horizontal filter in
        // which the pixels are ordered as follows:
        // [ 15 13 11 9 14 12 10 8 ] [ 7 5 3 1 6 4 2 0 ]
        const __m256i data_0 = yy_loadu_256(temp_ij + 0 * MAX_SB_SIZE);
        const __m256i data_1 = yy_loadu_256(temp_ij + 1 * MAX_SB_SIZE);
        const __m256i data_2 = yy_loadu_256(temp_ij + 2 * MAX_SB_SIZE);
        const __m256i data_3 = yy_loadu_256(temp_ij + 3 * MAX_SB_SIZE);
        const __m256i data_4 = yy_loadu_256(temp_ij + 4 * MAX_SB_SIZE);
        const __m256i data_5 = yy_loadu_256(temp_ij + 5 * MAX_SB_SIZE);
        const __m256i data_6 = yy_loadu_256(temp_ij + 6 * MAX_SB_SIZE);
        const __m256i data_7 = yy_loadu_256(temp_ij + 7 * MAX_SB_SIZE);

        // Filter the even-indices, increasing to 32-bit precision
        const __m256i src_0 = _mm256_unpacklo_epi16(data_0, data_1);
        const __m256i src_2 = _mm256_unpacklo_epi16(data_2, data_3);
        const __m256i src_4 = _mm256_unpacklo_epi16(data_4, data_5);
        const __m256i src_6 = _mm256_unpacklo_epi16(data_6, data_7);

        const __m256i res_0 = _mm256_madd_epi16(src_0, coeffs_01);
        const __m256i res_2 = _mm256_madd_epi16(src_2, coeffs_23);
        const __m256i res_4 = _mm256_madd_epi16(src_4, coeffs_45);
        const __m256i res_6 = _mm256_madd_epi16(src_6, coeffs_67);

        const __m256i res_even = _mm256_add_epi32(
            _mm256_add_epi32(res_0, res_2), _mm256_add_epi32(res_4, res_6));

        // Filter the odd-indices, increasing to 32-bit precision
        const __m256i src_1 = _mm256_unpackhi_epi16(data_0, data_1);
        const __m256i src_3 = _mm256_unpackhi_epi16(data_2, data_3);
        const __m256i src_5 = _mm256_unpackhi_epi16(data_4, data_5);
        const __m256i src_7 = _mm256_unpackhi_epi16(data_6, data_7);

        const __m256i res_1 = _mm256_madd_epi16(src_1, coeffs_01);
        const __m256i res_3 = _mm256_madd_epi16(src_3, coeffs_23);
        const __m256i res_5 = _mm256_madd_epi16(src_5, coeffs_45);
        const __m256i res_7 = _mm256_madd_epi16(src_7, coeffs_67);

        const __m256i res_odd = _mm256_add_epi32(
            _mm256_add_epi32(res_1, res_3), _mm256_add_epi32(res_5, res_7));

        // Pixels are currently in the following order:
        // res_even order: [ 14 12 10 8 ] [ 6 4 2 0 ]
        // res_odd order:  [ 15 13 11 9 ] [ 7 5 3 1 ]
        //
        // Rearrange the pixels into the following order:
        // res_lo order: [ 11 10  9  8 ] [ 3 2 1 0 ]
        // res_hi order: [ 15 14 13 12 ] [ 7 6 5 4 ]
        const __m256i res_lo = _mm256_unpacklo_epi32(res_even, res_odd);
        const __m256i res_hi = _mm256_unpackhi_epi32(res_even, res_odd);

        const __m256i res_lo_round = _mm256_srai_epi32(
            _mm256_add_epi32(res_lo, round_const), conv_params->round_1);
        const __m256i res_hi_round = _mm256_srai_epi32(
            _mm256_add_epi32(res_hi, round_const), conv_params->round_1);

        // Reduce to 16-bit precision and pack into the correct order:
        // [ 15 14 13 12 11 10 9 8 ][ 7 6 5 4 3 2 1 0 ]
        const __m256i res_16bit =
            _mm256_packs_epi32(res_lo_round, res_hi_round);
        const __m256i res_16bit_clamped = _mm256_min_epi16(
            _mm256_max_epi16(res_16bit, clamp_low), clamp_high);

        // Store in the dst array
        yy_storeu_256(dst + i * dst_stride + j, res_16bit_clamped);
      }
    }
  }
}